

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreaction.cc
# Opt level: O2

int4 __thiscall ActionDynamicSymbols::apply(ActionDynamicSymbols *this,Funcdata *data)

{
  int4 *piVar1;
  ScopeLocal *pSVar2;
  undefined8 *puVar3;
  Symbol *this_00;
  Varnode *pVVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Varnode *this_01;
  PcodeOp *pPVar8;
  Varnode **ppVVar9;
  HighVariable *pHVar10;
  ostream *poVar11;
  undefined8 *puVar12;
  int4 iVar13;
  string local_250;
  DynamicHash dhash;
  ostringstream s;
  
  pSVar2 = data->localmap;
  iVar6 = (*(pSVar2->super_ScopeInternal).super_Scope._vptr_Scope[0xc])(pSVar2);
  iVar7 = (*(pSVar2->super_ScopeInternal).super_Scope._vptr_Scope[0xd])(pSVar2);
  dhash.opedge.super__Vector_base<ToOpEdge,_std::allocator<ToOpEdge>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dhash.opedge.super__Vector_base<ToOpEdge,_std::allocator<ToOpEdge>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dhash.vnedge.super__Vector_base<const_Varnode_*,_std::allocator<const_Varnode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dhash.opedge.super__Vector_base<ToOpEdge,_std::allocator<ToOpEdge>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dhash.vnedge.super__Vector_base<const_Varnode_*,_std::allocator<const_Varnode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dhash.vnedge.super__Vector_base<const_Varnode_*,_std::allocator<const_Varnode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dhash.markvn.super__Vector_base<const_Varnode_*,_std::allocator<const_Varnode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dhash.markvn.super__Vector_base<const_Varnode_*,_std::allocator<const_Varnode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dhash.markop.super__Vector_base<const_PcodeOp_*,_std::allocator<const_PcodeOp_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dhash.markvn.super__Vector_base<const_Varnode_*,_std::allocator<const_Varnode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dhash.markop.super__Vector_base<const_PcodeOp_*,_std::allocator<const_PcodeOp_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dhash.markop.super__Vector_base<const_PcodeOp_*,_std::allocator<const_PcodeOp_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dhash.addrresult.base = (AddrSpace *)0x0;
  puVar3 = (undefined8 *)CONCAT44(extraout_var,iVar6);
  do {
    while( true ) {
      do {
        puVar12 = puVar3;
        if (puVar12 == (undefined8 *)CONCAT44(extraout_var_00,iVar7)) {
          DynamicHash::~DynamicHash(&dhash);
          return 0;
        }
        puVar3 = (undefined8 *)*puVar12;
        this_00 = (Symbol *)puVar12[2];
        DynamicHash::clear(&dhash);
        SymbolEntry::getFirstUseAddress((SymbolEntry *)&s);
        this_01 = DynamicHash::findVarnode(&dhash,data,(Address *)&s,puVar12[6]);
      } while ((this_01 == (Varnode *)0x0) || (this_01->mapentry == (SymbolEntry *)(puVar12 + 2)));
      if (this_01->size == *(int *)((long)puVar12 + 0x3c)) break;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
      std::operator<<((ostream *)&s,"Unable to use symbol ");
      bVar5 = Symbol::isNameUndefined(this_00);
      if (!bVar5) {
        poVar11 = std::operator<<((ostream *)&s,(string *)&this_00->name);
        std::operator<<(poVar11,' ');
      }
      std::operator<<((ostream *)&s,": Size does not match variable it labels");
      std::__cxx11::stringbuf::str();
      Funcdata::warningHeader(data,&local_250);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
    }
    if ((this_01->flags & 0x40) != 0) {
      if (((this_01->flags & 0x10) == 0) || (this_01->def->opcode->opcode != CPUI_CAST)) {
        pPVar8 = Varnode::loneDescend(this_01);
        if ((pPVar8 == (PcodeOp *)0x0) || (pPVar8->opcode->opcode != CPUI_CAST)) goto LAB_0031181d;
        ppVVar9 = &pPVar8->output;
      }
      else {
        ppVVar9 = (this_01->def->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      }
      pVVar4 = *ppVVar9;
      if ((pVVar4 != (Varnode *)0x0) && ((pVVar4->flags & 0x80) != 0)) {
        this_01 = pVVar4;
      }
    }
LAB_0031181d:
    iVar13 = -1;
    if ((*(byte *)((long)puVar12 + 0x1b) & 0xc) != 0) {
      iVar13 = *(int4 *)(puVar12 + 7);
    }
    pHVar10 = Varnode::getHigh(this_01);
    pHVar10->symbol = this_00;
    pHVar10->symboloffset = iVar13;
    if ((this_00->flags & 0x100) == 0) {
      (*(pSVar2->super_ScopeInternal).super_Scope._vptr_Scope[0x15])(pSVar2,this_00,this_01->type);
    }
    else if (this_00->type != this_01->type) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
      poVar11 = std::operator<<((ostream *)&s,"Unable to use type for symbol ");
      std::operator<<(poVar11,(string *)&this_00->name);
      std::__cxx11::stringbuf::str();
      Funcdata::warningHeader(data,&local_250);
      std::__cxx11::string::~string((string *)&local_250);
      (*(pSVar2->super_ScopeInternal).super_Scope._vptr_Scope[0x15])(pSVar2,this_00,this_01->type);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
    }
    piVar1 = &(this->super_Action).count;
    *piVar1 = *piVar1 + 1;
  } while( true );
}

Assistant:

int4 ActionDynamicSymbols::apply(Funcdata &data)

{
  ScopeLocal *localmap = data.getScopeLocal();
  list<SymbolEntry>::const_iterator iter,enditer;
  iter = localmap->beginDynamic();
  enditer = localmap->endDynamic();
  DynamicHash dhash;
  while(iter != enditer) {
    const SymbolEntry &entry( *iter );
    ++iter;
    Symbol *sym = entry.getSymbol();
    dhash.clear();
    Varnode *vn = dhash.findVarnode(&data,entry.getFirstUseAddress(),entry.getHash());
    if (vn == (Varnode *)0) {
      //      localmap->removeSymbol(sym); // If it didn't map to anything, remove it
      continue;
    }
    if (vn->getSymbolEntry() == &entry) continue; // Already applied it
    if (vn->getSize() != entry.getSize()) {
      ostringstream s;
      s << "Unable to use symbol ";
      if (!sym->isNameUndefined())
	s << sym->getName() << ' ';
      s << ": Size does not match variable it labels";
      data.warningHeader(s.str());
      //      localmap->removeSymbol(sym); // Don't use the symbol
      continue;
    }
    if (vn->getSymbolEntry() == &entry) continue; // Already applied it

    if (vn->isImplied()) {	// This should be finding an explicit, but a cast may have been inserted
      Varnode *newvn = (Varnode *)0;
      // Look at the "other side" of the cast
      if (vn->isWritten() && (vn->getDef()->code() == CPUI_CAST))
	newvn = vn->getDef()->getIn(0);
      else {
	PcodeOp *castop = vn->loneDescend();
	if ((castop != (PcodeOp *)0)&&(castop->code() == CPUI_CAST))
	  newvn = castop->getOut();
      }
      // See if the varnode on the other side is explicit
      if ((newvn != (Varnode *)0)&&(newvn->isExplicit()))
	vn = newvn;		// in which case we use it
    }

    int4 offset;
    if (!entry.isPiece())
      offset = -1;
    else
      offset = entry.getOffset();
    vn->getHigh()->setSymbol(sym,offset);
    if (!sym->isTypeLocked()) {	// If the dynamic symbol did not lock its type
      localmap->retypeSymbol(sym,vn->getType()); // use the type propagated into the varnode
    }
    else if (sym->getType() != vn->getType()) {
      ostringstream s;
      s << "Unable to use type for symbol " << sym->getName();
      data.warningHeader(s.str());
      localmap->retypeSymbol(sym,vn->getType()); // use the type propagated into the varnode
    }
    // FIXME: Setting the symbol here (for the first time) gives the type no time to propagate properly
    // Currently the casts aren't set properly

    count += 1;
  }
  return 0;
}